

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalBatchCopyToFile::AddRawBatchData
          (PhysicalBatchCopyToFile *this,ClientContext *context,GlobalSinkState *gstate_p,
          idx_t batch_index,
          unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>
          *raw_batch)

{
  pthread_mutex_t *__mutex;
  InternalException *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>_>,_bool>
  pVar1;
  allocator local_51;
  string local_50;
  
  __mutex = (pthread_mutex_t *)
            &gstate_p[3].super_StateWithBlockableTasks.blocked_tasks.
             super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ::std::mutex::lock((mutex *)&__mutex->__data);
  local_50._M_string_length =
       (size_type)
       (raw_batch->
       super_unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>)
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedRawBatchData_*,_std::default_delete<duckdb::FixedRawBatchData>_>
       .super__Head_base<0UL,_duckdb::FixedRawBatchData_*,_false>._M_head_impl;
  (raw_batch->
  super_unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>)._M_t
  .super___uniq_ptr_impl<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::FixedRawBatchData_*,_std::default_delete<duckdb::FixedRawBatchData>_>
  .super__Head_base<0UL,_duckdb::FixedRawBatchData_*,_false>._M_head_impl = (FixedRawBatchData *)0x0
  ;
  local_50._M_dataplus._M_p = (pointer)batch_index;
  pVar1 = ::std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>>>
          ::
          _M_emplace_unique<std::pair<unsigned_long,duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedRawBatchData,std::default_delete<duckdb::FixedRawBatchData>,true>>>>
                      *)(gstate_p + 5),
                     (pair<unsigned_long,_duckdb::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>,_true>_>
                      *)&local_50);
  ::std::unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>::
  ~unique_ptr((unique_ptr<duckdb::FixedRawBatchData,_std::default_delete<duckdb::FixedRawBatchData>_>
               *)&local_50._M_string_length);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pthread_mutex_unlock(__mutex);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Duplicate batch index %llu encountered in PhysicalFixedBatchCopy",
             &local_51);
  InternalException::InternalException<unsigned_long>(this_00,&local_50,batch_index);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void PhysicalBatchCopyToFile::AddRawBatchData(ClientContext &context, GlobalSinkState &gstate_p, idx_t batch_index,
                                              unique_ptr<FixedRawBatchData> raw_batch) const {
	auto &gstate = gstate_p.Cast<FixedBatchCopyGlobalState>();

	// add the batch index to the set of raw batches
	lock_guard<mutex> l(gstate.lock);
	auto entry = gstate.raw_batches.insert(make_pair(batch_index, std::move(raw_batch)));
	if (!entry.second) {
		throw InternalException("Duplicate batch index %llu encountered in PhysicalFixedBatchCopy", batch_index);
	}
}